

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int pmbtoken_issuer_key_from_bytes
              (PMBTOKEN_METHOD *method,TRUST_TOKEN_ISSUER_KEY *key,uint8_t *in,size_t len)

{
  EC_GROUP *group_00;
  EC_SCALAR *out;
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  uint8_t *in_00;
  size_t len_00;
  undefined1 local_4d8 [8];
  EC_AFFINE pub_affine [3];
  EC_JACOBIAN pub [3];
  size_t i;
  EC_SCALAR *scalars [6];
  size_t scalar_len;
  CBS tmp;
  CBS cbs;
  EC_GROUP *group;
  size_t len_local;
  uint8_t *in_local;
  TRUST_TOKEN_ISSUER_KEY *key_local;
  PMBTOKEN_METHOD *method_local;
  
  group_00 = method->group;
  CBS_init((CBS *)&tmp.len,in,len);
  bn = EC_GROUP_get0_order(group_00);
  uVar1 = BN_num_bytes(bn);
  scalars[0] = &key->y0;
  scalars[1] = &key->x1;
  scalars[2] = &key->y1;
  scalars[3] = &key->xs;
  scalars[4] = &key->ys;
  pub[2].Z.words[8] = 0;
  while( true ) {
    if (5 < pub[2].Z.words[8]) {
      iVar2 = ec_point_mul_scalar_precomp
                        (group_00,(EC_JACOBIAN *)(pub_affine[2].Y.words + 8),&method->g_precomp,
                         &key->x0,&method->h_precomp,&key->y0,(EC_PRECOMP *)0x0,(EC_SCALAR *)0x0);
      if ((((iVar2 != 0) &&
           (iVar2 = ec_init_precomp(group_00,&key->pub0_precomp,
                                    (EC_JACOBIAN *)(pub_affine[2].Y.words + 8)), iVar2 != 0)) &&
          (iVar2 = ec_point_mul_scalar_precomp
                             (group_00,(EC_JACOBIAN *)(pub[0].Z.words + 8),&method->g_precomp,
                              &key->x1,&method->h_precomp,&key->y1,(EC_PRECOMP *)0x0,
                              (EC_SCALAR *)0x0), iVar2 != 0)) &&
         (((iVar2 = ec_init_precomp(group_00,&key->pub1_precomp,(EC_JACOBIAN *)(pub[0].Z.words + 8))
           , iVar2 != 0 &&
           (iVar2 = ec_point_mul_scalar_precomp
                              (group_00,(EC_JACOBIAN *)(pub[1].Z.words + 8),&method->g_precomp,
                               &key->xs,&method->h_precomp,&key->ys,(EC_PRECOMP *)0x0,
                               (EC_SCALAR *)0x0), iVar2 != 0)) &&
          ((iVar2 = ec_init_precomp(group_00,&key->pubs_precomp,(EC_JACOBIAN *)(pub[1].Z.words + 8))
           , iVar2 != 0 &&
           (iVar2 = ec_jacobian_to_affine_batch
                              (group_00,(EC_AFFINE *)local_4d8,
                               (EC_JACOBIAN *)(pub_affine[2].Y.words + 8),3), iVar2 != 0)))))) {
        memcpy(&key->pub0,local_4d8,0x90);
        memcpy(&key->pub1,pub_affine[0].Y.words + 8,0x90);
        memcpy(&key->pubs,pub_affine[1].Y.words + 8,0x90);
        return 1;
      }
      return 0;
    }
    iVar2 = CBS_get_bytes((CBS *)&tmp.len,(CBS *)&scalar_len,(ulong)uVar1);
    if (iVar2 == 0) break;
    out = scalars[pub[2].Z.words[8] - 1];
    in_00 = CBS_data((CBS *)&scalar_len);
    len_00 = CBS_len((CBS *)&scalar_len);
    iVar2 = ec_scalar_from_bytes(group_00,out,in_00,len_00);
    if (iVar2 == 0) break;
    pub[2].Z.words[8] = pub[2].Z.words[8] + 1;
  }
  ERR_put_error(0x20,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,0x126);
  return 0;
}

Assistant:

static int pmbtoken_issuer_key_from_bytes(const PMBTOKEN_METHOD *method,
                                          TRUST_TOKEN_ISSUER_KEY *key,
                                          const uint8_t *in, size_t len) {
  const EC_GROUP *group = method->group;
  CBS cbs, tmp;
  CBS_init(&cbs, in, len);
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  EC_SCALAR *scalars[] = {&key->x0, &key->y0, &key->x1,
                          &key->y1, &key->xs, &key->ys};
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(scalars); i++) {
    if (!CBS_get_bytes(&cbs, &tmp, scalar_len) ||
        !ec_scalar_from_bytes(group, scalars[i], CBS_data(&tmp),
                              CBS_len(&tmp))) {
      OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
      return 0;
    }
  }

  // Recompute the public key.
  EC_JACOBIAN pub[3];
  EC_AFFINE pub_affine[3];
  if (!ec_point_mul_scalar_precomp(group, &pub[0], &method->g_precomp, &key->x0,
                                   &method->h_precomp, &key->y0, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub0_precomp, &pub[0]) ||
      !ec_point_mul_scalar_precomp(group, &pub[1], &method->g_precomp, &key->x1,
                                   &method->h_precomp, &key->y1, NULL, NULL) ||
      !ec_init_precomp(group, &key->pub1_precomp, &pub[1]) ||
      !ec_point_mul_scalar_precomp(group, &pub[2], &method->g_precomp, &key->xs,
                                   &method->h_precomp, &key->ys, NULL, NULL) ||
      !ec_init_precomp(group, &key->pubs_precomp, &pub[2]) ||
      !ec_jacobian_to_affine_batch(group, pub_affine, pub, 3)) {
    return 0;
  }

  key->pub0 = pub_affine[0];
  key->pub1 = pub_affine[1];
  key->pubs = pub_affine[2];
  return 1;
}